

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.h
# Opt level: O0

double __thiscall imrt::IntensityILS::perturbation(IntensityILS *this,Plan *P)

{
  int iVar1;
  Station *station;
  size_type sVar2;
  Station *in_RSI;
  long in_RDI;
  Plan *diff_00;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  Station *s;
  int r;
  int i;
  double eval;
  int in_stack_ffffffffffffff8c;
  Plan *in_stack_ffffffffffffff90;
  Plan *this_00;
  Station *local_28;
  undefined4 local_20;
  int local_1c;
  
  diff_00 = (Plan *)Plan::getEvaluation((Plan *)in_RSI);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x28); local_1c = local_1c + 1) {
    iVar1 = rand();
    station = (Station *)(long)iVar1;
    Plan::get_stations_abi_cxx11_((Plan *)in_RSI);
    sVar2 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::size
                      ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                       in_stack_ffffffffffffff90);
    local_20 = (undefined4)((ulong)station % sVar2);
    local_28 = Plan::get_station(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    this_00 = (Plan *)&stack0xffffffffffffffc0;
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x174045);
    Station::reduce_apertures
              (in_RSI,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      diff_00);
    in_stack_ffffffffffffff90 =
         (Plan *)Plan::incremental_eval
                           (this_00,station,
                            (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)in_stack_ffffffffffffff90);
    diff_00 = in_stack_ffffffffffffff90;
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x174088);
  }
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(in_RDI + 0x38);
  return (double)diff_00;
}

Assistant:

virtual double perturbation(Plan& P) {
		double eval=P.getEvaluation();
		for(int i=0; i<perturbation_size; i++){
			int r=rand()%P.get_stations().size();
			Station* s=P.get_station(r);
			list< pair< int, double > > diff;
			s->reduce_apertures(diff);
			eval=P.incremental_eval(*s,diff);
		}
		maxdelta=maxdelta0;
		maxratio=maxratio0;

		return(eval);
	}